

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::ProcessGetData
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,atomic<bool> *interruptMsgProc)

{
  bool bVar1;
  TxRelay *pTVar2;
  uint256 *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> PVar3;
  PeerManagerImpl *unaff_retaddr;
  duration<long,_std::ratio<1L,_1L>_> *inv_1;
  duration<long,_std::ratio<1L,_1L>_> *inv;
  TxRelay *tx_relay;
  TransactionSerParams maybe_with_witness;
  CTransactionRef tx;
  vector<CInv,_std::allocator<CInv>_> vNotFound;
  iterator it;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  Peer *in_stack_fffffffffffffd50;
  CInv *in_stack_fffffffffffffd58;
  _Deque_iterator<CInv,_CInv_&,_CInv_*> *in_stack_fffffffffffffd60;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> *in_stack_fffffffffffffd78;
  vector<CInv,_std::allocator<CInv>_> *args;
  const_iterator *in_stack_fffffffffffffd80;
  undefined6 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8e;
  undefined1 in_stack_fffffffffffffd8f;
  byte bVar4;
  PeerManagerImpl *in_stack_fffffffffffffd90;
  CTransaction *in_stack_fffffffffffffd98;
  TransactionSerParams *in_stack_fffffffffffffda0;
  uint256 *txid;
  CTxMemPool *this_00;
  TransactionSerParams *local_248;
  bool local_231;
  undefined1 local_1d1 [129];
  const_iterator local_150 [2];
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_110;
  undefined1 local_f9;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffffe8;
  Peer *in_stack_fffffffffffffff0;
  CNode *pfrom_00;
  
  pfrom_00 = *(CNode **)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd4c,(RecursiveMutex *)0x2c6817);
  pTVar2 = Peer::GetTxRelay(in_stack_fffffffffffffd50);
  std::deque<CInv,_std::allocator<CInv>_>::begin
            ((deque<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffd50);
  std::vector<CInv,_std::allocator<CInv>_>::vector
            ((vector<CInv,_std::allocator<CInv>_> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  PVar3.m_object = in_stack_fffffffffffffd98;
  PVar3.m_params = in_stack_fffffffffffffda0;
  while( true ) {
    std::deque<CInv,_std::allocator<CInv>_>::end
              ((deque<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffd50);
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffd58,(_Self *)in_stack_fffffffffffffd50);
    local_231 = false;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::_Deque_iterator<CInv,_CInv_&,_CInv_*>::operator->
                ((_Deque_iterator<CInv,_CInv_&,_CInv_*> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_231 = CInv::IsGenTxMsg((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd58)
      ;
    }
    if (local_231 == false) break;
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd60);
    if (bVar1) goto LAB_002c6dde;
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd60);
    if (bVar1) break;
    std::_Deque_iterator<CInv,_CInv_&,_CInv_*>::operator++
              (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    std::_Deque_iterator<CInv,_CInv_&,_CInv_*>::operator*
              ((_Deque_iterator<CInv,_CInv_&,_CInv_*> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    if (pTVar2 != (TxRelay *)0x0) {
      ToGenTxid(in_stack_fffffffffffffd58);
      FindTxForGetData((PeerManagerImpl *)PVar3.m_params,(TxRelay *)PVar3.m_object,
                       (GenTxid *)in_stack_fffffffffffffd90);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      if (bVar1) {
        bVar1 = CInv::IsMsgTx((duration<long,_std::ratio<1L,_1L>_> *)
                              CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        if (bVar1) {
          local_248 = &::TX_NO_WITNESS;
        }
        else {
          local_248 = &::TX_WITH_WITNESS;
        }
        local_f9 = local_248->allow_witness;
        this_00 = (CTxMemPool *)&stack0xffffffffffffff06;
        txid = in_RSI;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   PVar3.m_object,(char *)in_stack_fffffffffffffd90,
                   (allocator<char> *)
                   CONCAT17(in_stack_fffffffffffffd8f,
                            CONCAT16(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88)));
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffd58);
        PVar3 = TransactionSerParams::operator()
                          ((TransactionSerParams *)in_stack_fffffffffffffd58,
                           (CTransaction *)in_stack_fffffffffffffd50);
        local_110 = PVar3;
        (anonymous_namespace)::PeerManagerImpl::
        MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                  (in_stack_fffffffffffffd90,
                   (CNode *)CONCAT17(in_stack_fffffffffffffd8f,
                                     CONCAT16(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88)),
                   (string *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff06);
        in_stack_fffffffffffffd90 = *(PeerManagerImpl **)(in_RDI + 0x120);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        CTransaction::GetHash
                  ((CTransaction *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        transaction_identifier::operator_cast_to_uint256_
                  ((transaction_identifier<false> *)
                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        CTxMemPool::RemoveUnbroadcastTx(this_00,txid,PVar3.m_params._7_1_);
      }
      else {
        std::vector<CInv,_std::allocator<CInv>_>::push_back
                  ((vector<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffd58,
                   (value_type *)in_stack_fffffffffffffd50);
      }
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    }
  }
  std::deque<CInv,_std::allocator<CInv>_>::end
            ((deque<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffd50);
  bVar1 = std::operator==((_Self *)in_stack_fffffffffffffd58,(_Self *)in_stack_fffffffffffffd50);
  bVar4 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd60);
    bVar4 = bVar1 ^ 0xff;
  }
  if ((bVar4 & 1) != 0) {
    in_stack_fffffffffffffd80 = local_150;
    std::_Deque_iterator<CInv,_CInv_&,_CInv_*>::operator++
              (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    std::_Deque_iterator<CInv,_CInv_&,_CInv_*>::operator*
              ((_Deque_iterator<CInv,_CInv_&,_CInv_*> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    in_stack_fffffffffffffd8e =
         CInv::IsGenBlkMsg((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd58);
    if ((bool)in_stack_fffffffffffffd8e) {
      ProcessGetBlockData(unaff_retaddr,pfrom_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8
                         );
    }
  }
  std::deque<CInv,_std::allocator<CInv>_>::begin
            ((deque<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffd50);
  std::_Deque_iterator<CInv,CInv_const&,CInv_const*>::
  _Deque_iterator<std::_Deque_iterator<CInv,CInv&,CInv*>,void>
            ((_Deque_iterator<CInv,_const_CInv_&,_const_CInv_*> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             (_Deque_iterator<CInv,_CInv_&,_CInv_*> *)0x2c6cbe);
  args = (vector<CInv,_std::allocator<CInv>_> *)(local_1d1 + 0x21);
  std::_Deque_iterator<CInv,CInv_const&,CInv_const*>::
  _Deque_iterator<std::_Deque_iterator<CInv,CInv&,CInv*>,void>
            ((_Deque_iterator<CInv,_const_CInv_&,_const_CInv_*> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             (_Deque_iterator<CInv,_CInv_&,_CInv_*> *)0x2c6cd8);
  std::deque<CInv,_std::allocator<CInv>_>::erase
            ((deque<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffd90,
             (const_iterator *)
             CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88)),
             in_stack_fffffffffffffd80);
  bVar1 = std::vector<CInv,_std::allocator<CInv>_>::empty
                    ((vector<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffd58);
  if (!bVar1) {
    in_stack_fffffffffffffd58 = (CInv *)local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)PVar3.m_object,
               (char *)in_stack_fffffffffffffd90,
               (allocator<char> *)
               CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88)));
    (anonymous_namespace)::PeerManagerImpl::
    MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
              (in_stack_fffffffffffffd90,
               (CNode *)CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88)
                                ),(string *)in_stack_fffffffffffffd80,args);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  }
LAB_002c6dde:
  std::vector<CInv,_std::allocator<CInv>_>::~vector
            ((vector<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffd58);
  if (*(CNode **)(in_FS_OFFSET + 0x28) != pfrom_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetData(CNode& pfrom, Peer& peer, const std::atomic<bool>& interruptMsgProc)
{
    AssertLockNotHeld(cs_main);

    auto tx_relay = peer.GetTxRelay();

    std::deque<CInv>::iterator it = peer.m_getdata_requests.begin();
    std::vector<CInv> vNotFound;

    // Process as many TX items from the front of the getdata queue as
    // possible, since they're common and it's efficient to batch process
    // them.
    while (it != peer.m_getdata_requests.end() && it->IsGenTxMsg()) {
        if (interruptMsgProc) return;
        // The send buffer provides backpressure. If there's no space in
        // the buffer, pause processing until the next call.
        if (pfrom.fPauseSend) break;

        const CInv &inv = *it++;

        if (tx_relay == nullptr) {
            // Ignore GETDATA requests for transactions from block-relay-only
            // peers and peers that asked us not to announce transactions.
            continue;
        }

        CTransactionRef tx = FindTxForGetData(*tx_relay, ToGenTxid(inv));
        if (tx) {
            // WTX and WITNESS_TX imply we serialize with witness
            const auto maybe_with_witness = (inv.IsMsgTx() ? TX_NO_WITNESS : TX_WITH_WITNESS);
            MakeAndPushMessage(pfrom, NetMsgType::TX, maybe_with_witness(*tx));
            m_mempool.RemoveUnbroadcastTx(tx->GetHash());
        } else {
            vNotFound.push_back(inv);
        }
    }

    // Only process one BLOCK item per call, since they're uncommon and can be
    // expensive to process.
    if (it != peer.m_getdata_requests.end() && !pfrom.fPauseSend) {
        const CInv &inv = *it++;
        if (inv.IsGenBlkMsg()) {
            ProcessGetBlockData(pfrom, peer, inv);
        }
        // else: If the first item on the queue is an unknown type, we erase it
        // and continue processing the queue on the next call.
    }

    peer.m_getdata_requests.erase(peer.m_getdata_requests.begin(), it);

    if (!vNotFound.empty()) {
        // Let the peer know that we didn't find what it asked for, so it doesn't
        // have to wait around forever.
        // SPV clients care about this message: it's needed when they are
        // recursively walking the dependencies of relevant unconfirmed
        // transactions. SPV clients want to do that because they want to know
        // about (and store and rebroadcast and risk analyze) the dependencies
        // of transactions relevant to them, without having to download the
        // entire memory pool.
        // Also, other nodes can use these messages to automatically request a
        // transaction from some other peer that announced it, and stop
        // waiting for us to respond.
        // In normal operation, we often send NOTFOUND messages for parents of
        // transactions that we relay; if a peer is missing a parent, they may
        // assume we have them and request the parents from us.
        MakeAndPushMessage(pfrom, NetMsgType::NOTFOUND, vNotFound);
    }
}